

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyraytracer.cpp
# Opt level: O2

bool scene_intersect(Vec3f *orig,Vec3f *dir,vector<Sphere,_std::allocator<Sphere>_> *spheres,
                    Vec3f *hit,Vec3f *N,Material *material)

{
  pointer pSVar1;
  uint uVar2;
  ulong uVar3;
  undefined8 uVar4;
  bool bVar5;
  vec<3UL,_float> *pvVar6;
  pointer pSVar7;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  vec<3UL,_float> lhs;
  float d;
  undefined8 uStack_ac;
  float dist_i;
  Vec3f *local_a0;
  Vec3f *local_98;
  Material *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Vec3f *local_70;
  Sphere sphere;
  vec<3UL,_float> vVar12;
  
  pSVar1 = (spheres->super__Vector_base<Sphere,_std::allocator<Sphere>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  fVar11 = 3.4028235e+38;
  local_a0 = N;
  local_98 = hit;
  local_90 = material;
  local_70 = orig;
  for (pSVar7 = (spheres->super__Vector_base<Sphere,_std::allocator<Sphere>_>)._M_impl.
                super__Vector_impl_data._M_start; pSVar7 != pSVar1; pSVar7 = pSVar7 + 1) {
    sphere.material.specular_exponent = (pSVar7->material).specular_exponent;
    sphere.center.x = (pSVar7->center).x;
    sphere.center.y = (pSVar7->center).y;
    uVar4 = *(undefined8 *)&(pSVar7->center).z;
    sphere.material.refractive_index = (pSVar7->material).refractive_index;
    sphere.material.albedo.x = (pSVar7->material).albedo.x;
    sphere.material.albedo.y = (pSVar7->material).albedo.y;
    sphere.material.albedo.z = (pSVar7->material).albedo.z;
    sphere.material._16_8_ = *(undefined8 *)&(pSVar7->material).albedo.w;
    sphere.material.diffuse_color.y = (pSVar7->material).diffuse_color.y;
    sphere.material.diffuse_color.z = (pSVar7->material).diffuse_color.z;
    sphere.center.z = (float)uVar4;
    sphere.radius = (float)((ulong)uVar4 >> 0x20);
    bVar5 = Sphere::ray_intersect(&sphere,orig,dir,&dist_i);
    fVar10 = dist_i;
    if ((bVar5) && (dist_i < fVar11)) {
      local_88._0_4_ = orig->x;
      local_88._4_4_ = orig->y;
      uStack_80 = 0;
      fVar11 = orig->z;
      _d = operator*(dir,&dist_i);
      lhs.z = fVar11;
      lhs.x = (float)(undefined4)local_88;
      lhs.y = (float)local_88._4_4_;
      vVar12 = operator+(lhs,(vec<3UL,_float> *)&d);
      local_98->x = vVar12.x;
      local_98->y = vVar12.y;
      local_98->z = vVar12.z;
      _d = operator-(vVar12,&sphere.center);
      orig = local_70;
      pvVar6 = vec<3UL,_float>::normalize((vec<3UL,_float> *)&d,1.0);
      fVar11 = pvVar6->y;
      local_a0->x = pvVar6->x;
      local_a0->y = fVar11;
      local_a0->z = pvVar6->z;
      local_90->specular_exponent = sphere.material.specular_exponent;
      *(undefined8 *)&(local_90->albedo).w = sphere.material._16_8_;
      (local_90->diffuse_color).y = sphere.material.diffuse_color.y;
      (local_90->diffuse_color).z = sphere.material.diffuse_color.z;
      local_90->refractive_index = sphere.material.refractive_index;
      (local_90->albedo).x = sphere.material.albedo.x;
      (local_90->albedo).y = sphere.material.albedo.y;
      (local_90->albedo).z = sphere.material.albedo.z;
      fVar11 = fVar10;
    }
  }
  if (ABS(dir->y) <= 0.001) {
    fVar10 = 3.4028235e+38;
  }
  else {
    d = -(orig->y + 4.0) / dir->y;
    local_88._0_4_ = orig->x;
    local_88._4_4_ = orig->y;
    uStack_80 = 0;
    fVar10 = orig->z;
    vVar12 = operator*(dir,&d);
    sphere.center._0_8_ = vVar12._0_8_;
    sphere.center.z = vVar12.z;
    vVar12.z = fVar10;
    vVar12.x = (float)(undefined4)local_88;
    vVar12.y = (float)local_88._4_4_;
    vVar12 = operator+(vVar12,&sphere.center);
    fVar10 = 3.4028235e+38;
    if ((((0.0 < d) && (ABS(vVar12.x) < 10.0)) && (vVar12.z < -10.0)) &&
       ((-30.0 < vVar12.z && (d < fVar11)))) {
      local_98->x = vVar12.x;
      local_98->y = vVar12.y;
      local_98->z = vVar12.z;
      local_a0->x = 0.0;
      local_a0->y = 1.0;
      local_a0->z = 0.0;
      uVar2 = (uint)(((int)(local_98->z * 0.5) + (int)(local_98->x * 0.5 + 1000.0) & 1U) == 0);
      uVar8 = CONCAT44((int)(uVar2 << 0x1f) >> 0x1f,(int)(uVar2 << 0x1f) >> 0x1f);
      uVar3 = (ulong)DAT_00103050;
      uVar9 = (ulong)DAT_00103060;
      (local_90->diffuse_color).x = 0.3;
      uVar9 = uVar8 & uVar9 | ~uVar8 & uVar3;
      (local_90->diffuse_color).y = (float)(int)uVar9;
      (local_90->diffuse_color).z = (float)(int)(uVar9 >> 0x20);
      fVar10 = d;
    }
  }
  if (fVar11 <= fVar10) {
    fVar10 = fVar11;
  }
  return fVar10 < 1000.0;
}

Assistant:

bool scene_intersect(Vec3f const& orig, Vec3f const& dir,
                     std::vector<Sphere> const& spheres, Vec3f& hit, Vec3f& N,
                     Material& material)
{
  auto spheres_dist = std::numeric_limits<float>::max();
  for (auto sphere : spheres)
  {
    float dist_i;
    if (sphere.ray_intersect(orig, dir, dist_i) && dist_i < spheres_dist)
    {
      spheres_dist = dist_i;
      hit          = orig + dir * dist_i;
      N            = (hit - sphere.center).normalize();
      material     = sphere.material;
    }
  }

  float checkerboard_dist = std::numeric_limits<float>::max();
  if (fabs(dir.y) > 1e-3f)
  {
    float d  = -(orig.y + 4) / dir.y;  // Checkerboard plane is y = -4
    Vec3f pt = orig + dir * d;
    if (d > 0 && fabs(pt.x) < 10 && pt.z < -10 && pt.z > -30 &&
        d < spheres_dist)
    {
      checkerboard_dist = d;
      hit               = pt;
      N                 = Vec3f(0, 1, 0);
      material.diffuse_color =
          (int(.5f * hit.x + 1000) + int(.5f * hit.z)) & 1  // NOLINT
              ? Vec3f(.3f, .3f, .3f)
              : Vec3f(.3f, .2f, .1f);
    }
  }
  return std::min(spheres_dist, checkerboard_dist) < 1000;
}